

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O1

void standard_palette_init(standard_display *dp)

{
  png_store *ps;
  png_store_file *ppVar1;
  long lVar2;
  int iVar3;
  store_palette_entry *__src;
  long lVar4;
  
  ps = dp->ps;
  ppVar1 = ps->current;
  if (ppVar1 == (png_store_file *)0x0) {
    store_log(ps,ps->pread,"no current stream for palette",1);
    __src = (store_palette_entry *)0x0;
  }
  else {
    dp->npalette = ppVar1->npalette;
    __src = ppVar1->palette;
  }
  lVar4 = (long)dp->npalette;
  if (0 < lVar4) {
    memcpy(dp->palette,__src,lVar4 * 4);
    do {
      if (lVar4 < 1) {
        iVar3 = 0;
        goto LAB_0010c5dd;
      }
      lVar2 = lVar4 + -1;
      lVar4 = lVar4 + -1;
    } while (__src[lVar2].alpha == 0xff);
    iVar3 = 1;
LAB_0010c5dd:
    dp->is_transparent = iVar3;
  }
  return;
}

Assistant:

static void
standard_palette_init(standard_display *dp)
{
   store_palette_entry *palette = store_current_palette(dp->ps, &dp->npalette);

   /* The remaining entries remain white/opaque. */
   if (dp->npalette > 0)
   {
      int i = dp->npalette;
      memcpy(dp->palette, palette, i * sizeof *palette);

      /* Check for a non-opaque palette entry: */
      while (--i >= 0)
         if (palette[i].alpha < 255)
            break;

#     ifdef __GNUC__
         /* GCC can't handle the more obviously optimizable version. */
         if (i >= 0)
            dp->is_transparent = 1;
         else
            dp->is_transparent = 0;
#     else
         dp->is_transparent = (i >= 0);
#     endif
   }
}